

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicState1::Run(BasicState1 *this)

{
  CallLogWrapper *pCVar1;
  bool bVar2;
  BasicState1 *pBVar3;
  bool bVar4;
  bool bVar5;
  GLuint i_1;
  GLuint i;
  int iVar6;
  GLint p;
  VertexBindingState vb0;
  VertexBindingState vb;
  VertexBindingState vb2;
  VertexBindingState vb15;
  uint local_23c;
  VertexBindingState local_238;
  VertexAttribState local_1f0;
  BasicState1 *local_190;
  CallLogWrapper *local_188;
  VertexBindingState local_180;
  VertexBindingState local_138;
  VertexAttribState local_f0;
  VertexAttribState local_90;
  
  pCVar1 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(pCVar1,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(pCVar1,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_vbo[2]);
  glu::CallLogWrapper::glBufferData(pCVar1,0x8892,10000,(void *)0x0,0x88ea);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,0);
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x82da,(GLint *)&local_23c);
  bVar5 = 0xf < (int)local_23c;
  if (!bVar5) {
    anon_unknown_0::Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n");
  }
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x82d9,(GLint *)&local_23c);
  bVar4 = (int)local_23c < 0x7ff;
  if (bVar4) {
    anon_unknown_0::Output
              ("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n");
  }
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x82e5,(GLint *)&local_23c);
  bVar2 = (int)local_23c < 0x800;
  if (bVar2) {
    anon_unknown_0::Output("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n");
  }
  glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
  local_188 = pCVar1;
  glu::CallLogWrapper::glGetIntegerv(pCVar1,0x8895,(GLint *)&local_23c);
  if (local_23c != 0) {
    anon_unknown_0::Output
              ("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n",(ulong)local_23c,0);
  }
  bVar5 = local_23c == 0 && (!bVar2 && (!bVar4 && bVar5));
  iVar6 = 0;
  do {
    deqp::GLWrapper::GLWrapper(&local_1f0.super_GLWrapper);
    local_1f0.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103358;
    local_1f0.array_enabled = 0;
    local_1f0.array_size = 4;
    local_1f0.array_stride = 0;
    local_1f0.array_type = 0x1406;
    local_1f0.array_normalized = 0;
    local_1f0.array_integer = 0;
    local_1f0.array_divisor = 0;
    local_1f0.array_pointer = 0;
    local_1f0.array_buffer_binding = 0;
    local_1f0.relative_offset = 0;
    local_1f0.binding = iVar6;
    local_1f0.index = iVar6;
    bVar4 = VertexAttribState::stateVerify(&local_1f0);
    if (!bVar4) {
      bVar5 = false;
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_1f0.super_GLWrapper.super_CallLogWrapper);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x10);
  iVar6 = 0;
  local_190 = this;
  do {
    deqp::GLWrapper::GLWrapper(&local_1f0.super_GLWrapper);
    local_1f0.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103390;
    local_1f0.array_enabled = 0;
    local_1f0.array_stride = 0;
    local_1f0.array_type = 0;
    local_1f0.array_normalized = 0x10;
    local_1f0.array_integer = 0;
    local_1f0.array_divisor = iVar6;
    bVar4 = VertexBindingState::stateVerify((VertexBindingState *)&local_1f0);
    if (!bVar4) {
      bVar5 = false;
    }
    glu::CallLogWrapper::~CallLogWrapper(&local_1f0.super_GLWrapper.super_CallLogWrapper);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x10);
  if (!bVar5) {
    bVar5 = false;
    anon_unknown_0::Output("Default state check failed.\n");
  }
  deqp::GLWrapper::GLWrapper(&local_1f0.super_GLWrapper);
  local_1f0.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103358;
  local_1f0.array_divisor = 0;
  local_1f0.array_pointer = 0;
  local_1f0.array_buffer_binding = 0;
  local_1f0.binding = 0;
  local_1f0.index = 0;
  local_1f0.array_enabled = 0;
  local_1f0.array_size = 2;
  local_1f0.array_stride = 0;
  local_1f0.array_type = 0x1400;
  local_1f0.array_normalized = 1;
  local_1f0.array_integer = 0;
  local_1f0.relative_offset = 0x10;
  deqp::GLWrapper::GLWrapper(&local_238.super_GLWrapper);
  pCVar1 = local_188;
  pBVar3 = local_190;
  local_238.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103390;
  local_238.buffer = 0;
  local_238.offset = 0;
  local_238.stride = 0x10;
  local_238.divisor = 0;
  local_238.index = 0;
  glu::CallLogWrapper::glVertexAttribFormat(local_188,0,2,0x1400,'\x01',0x10);
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e056;
  }
  else {
LAB_00c0e056:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
  }
  deqp::GLWrapper::GLWrapper(&local_f0.super_GLWrapper);
  local_f0.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103358;
  local_f0.array_enabled = 0;
  local_f0.array_size = 3;
  local_f0.array_stride = 0;
  local_f0.array_type = 0x1404;
  local_f0.array_normalized = 0;
  local_f0.array_integer = 1;
  local_f0.array_divisor = 0;
  local_f0.array_pointer = 0;
  local_f0.array_buffer_binding = 0;
  local_f0.binding = 2;
  local_f0.relative_offset = 0x200;
  local_f0.index = 2;
  deqp::GLWrapper::GLWrapper(&local_180.super_GLWrapper);
  local_180.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103390;
  local_180.buffer = 0;
  local_180.offset = 0;
  local_180.stride = 0x10;
  local_180.divisor = 0;
  local_180.index = 2;
  glu::CallLogWrapper::glVertexAttribIFormat(pCVar1,2,3,0x1404,0x200);
  bVar4 = VertexAttribState::stateVerify(&local_f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_180);
    if (!bVar4) goto LAB_00c0e14b;
  }
  else {
LAB_00c0e14b:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribIFormat state change check failed.\n");
  }
  local_238.buffer = pBVar3->m_vbo[0];
  local_238.offset = 0x800;
  local_238.stride = 0x80;
  local_1f0.array_buffer_binding = local_238.buffer;
  glu::CallLogWrapper::glBindVertexBuffer(pCVar1,0,local_238.buffer,0x800,0x80);
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e1ac;
  }
  else {
LAB_00c0e1ac:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  local_180.buffer = pBVar3->m_vbo[2];
  local_f0.array_buffer_binding = local_180.buffer;
  local_180.offset = 0x40;
  local_180.stride = 0x100;
  glu::CallLogWrapper::glBindVertexBuffer(pCVar1,2,local_180.buffer,0x40,0x100);
  bVar4 = VertexAttribState::stateVerify(&local_f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_180);
    if (!bVar4) goto LAB_00c0e21f;
  }
  else {
LAB_00c0e21f:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribBinding(pCVar1,2,0);
  local_f0.binding = 0;
  local_f0.array_buffer_binding = pBVar3->m_vbo[0];
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e292;
    bVar4 = VertexAttribState::stateVerify(&local_f0);
    if (!bVar4) goto LAB_00c0e292;
    bVar4 = VertexBindingState::stateVerify(&local_180);
    if (!bVar4) goto LAB_00c0e292;
  }
  else {
LAB_00c0e292:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  deqp::GLWrapper::GLWrapper(&local_90.super_GLWrapper);
  local_90.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103358;
  local_90.array_enabled = 0;
  local_90.array_size = 4;
  local_90.array_stride = 0;
  local_90.array_type = 0x1406;
  local_90.array_normalized = 0;
  local_90.array_integer = 0;
  local_90.array_divisor = 0;
  local_90.array_pointer = 0;
  local_90.array_buffer_binding = 0;
  local_90.binding = 0xf;
  local_90.relative_offset = 0;
  local_90.index = 0xf;
  deqp::GLWrapper::GLWrapper(&local_138.super_GLWrapper);
  local_138.super_GLWrapper._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_02103390;
  local_138.buffer = 0;
  local_138.offset = 0;
  local_138.stride = 0x10;
  local_138.divisor = 0;
  local_138.index = 0xf;
  glu::CallLogWrapper::glVertexAttribBinding(pCVar1,0,0xf);
  local_1f0.array_buffer_binding = 0;
  local_1f0.binding = 0xf;
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e397;
    bVar4 = VertexAttribState::stateVerify(&local_90);
    if (!bVar4) goto LAB_00c0e397;
    bVar4 = VertexBindingState::stateVerify(&local_138);
    if (!bVar4) goto LAB_00c0e397;
  }
  else {
LAB_00c0e397:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  glu::CallLogWrapper::glBindVertexBuffer(pCVar1,0xf,pBVar3->m_vbo[1],0x10,0x20);
  local_1f0.array_buffer_binding = pBVar3->m_vbo[1];
  local_90.array_buffer_binding = local_1f0.array_buffer_binding;
  local_138.offset = 0x10;
  local_138.stride = 0x20;
  local_138.buffer = local_1f0.array_buffer_binding;
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e42d;
    bVar4 = VertexAttribState::stateVerify(&local_90);
    if (!bVar4) goto LAB_00c0e42d;
    bVar4 = VertexBindingState::stateVerify(&local_138);
    if (!bVar4) goto LAB_00c0e42d;
  }
  else {
LAB_00c0e42d:
    bVar5 = false;
    anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribFormat(pCVar1,0xf,1,0x140b,'\0',0x400);
  local_90.array_size = 1;
  local_90.array_type = 0x140b;
  local_90.relative_offset = 0x400;
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e4de;
    bVar4 = VertexAttribState::stateVerify(&local_f0);
    if (!bVar4) goto LAB_00c0e4de;
    bVar4 = VertexBindingState::stateVerify(&local_180);
    if (!bVar4) goto LAB_00c0e4de;
    bVar4 = VertexAttribState::stateVerify(&local_90);
    if (!bVar4) goto LAB_00c0e4de;
    bVar4 = VertexBindingState::stateVerify(&local_138);
    if (!bVar4) goto LAB_00c0e4de;
  }
  else {
LAB_00c0e4de:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribFormat state change check failed.\n");
  }
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,pBVar3->m_vbo[2]);
  glu::CallLogWrapper::glVertexAttribPointer(pCVar1,0,4,0x1401,'\0',8,(void *)0x280);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,0);
  local_1f0.array_size = 4;
  local_1f0.array_stride = 8;
  local_1f0.array_type = 0x1401;
  local_1f0.array_normalized = 0;
  local_1f0.array_pointer = 0x280;
  local_1f0.binding = 0;
  local_1f0.relative_offset = 0;
  local_238.buffer = pBVar3->m_vbo[2];
  local_238.offset = 0x280;
  local_238.stride = 8;
  local_f0.array_buffer_binding = local_238.buffer;
  local_1f0.array_buffer_binding = local_238.buffer;
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (!bVar4) goto LAB_00c0e5d9;
    bVar4 = VertexAttribState::stateVerify(&local_f0);
    if (!bVar4) goto LAB_00c0e5d9;
    bVar4 = VertexBindingState::stateVerify(&local_180);
    if (!bVar4) goto LAB_00c0e5d9;
    bVar4 = VertexAttribState::stateVerify(&local_90);
    if (!bVar4) goto LAB_00c0e5d9;
    bVar4 = VertexBindingState::stateVerify(&local_138);
    if (!bVar4) goto LAB_00c0e5d9;
  }
  else {
LAB_00c0e5d9:
    bVar5 = false;
    anon_unknown_0::Output("glVertexAttribPointer state change check failed.\n");
  }
  glu::CallLogWrapper::glBindVertexBuffer(pCVar1,0,pBVar3->m_vbo[1],0x50,0x18);
  local_238.buffer = pBVar3->m_vbo[1];
  local_238.offset = 0x50;
  local_238.stride = 0x18;
  local_f0.array_buffer_binding = local_238.buffer;
  local_1f0.array_buffer_binding = local_238.buffer;
  bVar4 = VertexAttribState::stateVerify(&local_1f0);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&local_238);
    if (bVar4) {
      bVar4 = VertexAttribState::stateVerify(&local_f0);
      if (bVar4) {
        bVar4 = VertexBindingState::stateVerify(&local_180);
        if (bVar4) {
          bVar4 = VertexAttribState::stateVerify(&local_90);
          if (bVar4) {
            bVar4 = VertexBindingState::stateVerify(&local_138);
            if (bVar4) goto LAB_00c0e695;
          }
        }
      }
    }
  }
  bVar5 = false;
  anon_unknown_0::Output("glBindVertexBuffer state change check failed.\n");
LAB_00c0e695:
  glu::CallLogWrapper::~CallLogWrapper(&local_138.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_90.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_180.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_f0.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_238.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&local_1f0.super_GLWrapper.super_CallLogWrapper);
  return -(ulong)(~bVar5 & 1);
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glBufferData(GL_ARRAY_BUFFER, 10000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		if (p < 16)
		{
			Output("GL_MAX_VERTEX_ATTRIB_BINDINGS is %d but must be at least 16.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, &p);
		if (p < 2047)
		{
			Output("GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET is %d but must be at least 2047.\n", p);
			status = false;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_STRIDE, &p);
		if (p < 2048)
		{
			Output("GL_MAX_VERTEX_ATTRIB_STRIDE is %d but must be at least 2048.\n", p);
			status = false;
		}

		glBindVertexArray(m_vao);
		// check default state
		glGetIntegerv(GL_ELEMENT_ARRAY_BUFFER_BINDING, &p);
		if (0 != p)
		{
			Output("GL_ELEMENT_ARRAY_BUFFER_BINDING is %d should be %d.\n", p, 0);
			status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState va(i);
			if (!va.stateVerify())
				status = false;
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexBindingState vb(i);
			if (!vb.stateVerify())
				status = false;
		}
		if (!status)
		{
			Output("Default state check failed.\n");
			status = false;
		}

		VertexAttribState va0(0);
		va0.array_size		 = 2;
		va0.array_type		 = GL_BYTE;
		va0.array_normalized = 1;
		va0.relative_offset  = 16;
		VertexBindingState vb0(0);
		glVertexAttribFormat(0, 2, GL_BYTE, GL_TRUE, 16);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		VertexAttribState va2(2);
		va2.array_size		= 3;
		va2.array_type		= GL_INT;
		va2.array_integer   = 1;
		va2.relative_offset = 512;
		VertexBindingState vb2(2);
		glVertexAttribIFormat(2, 3, GL_INT, 512);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribIFormat state change check failed.\n");
			status = false;
		}

		va0.array_buffer_binding = m_vbo[0];
		vb0.buffer				 = m_vbo[0];
		vb0.offset				 = 2048;
		vb0.stride				 = 128;
		glBindVertexBuffer(0, m_vbo[0], 2048, 128);
		if (!va0.stateVerify() || !vb0.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		va2.array_buffer_binding = m_vbo[2];
		vb2.buffer				 = m_vbo[2];
		vb2.offset				 = 64;
		vb2.stride				 = 256;
		glBindVertexBuffer(2, m_vbo[2], 64, 256);
		if (!va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribBinding(2, 0);
		va2.binding				 = 0;
		va2.array_buffer_binding = m_vbo[0];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		VertexAttribState  va15(15);
		VertexBindingState vb15(15);
		glVertexAttribBinding(0, 15);
		va0.binding				 = 15;
		va0.array_buffer_binding = 0;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(15, m_vbo[1], 16, 32);
		va0.array_buffer_binding  = m_vbo[1];
		va15.array_buffer_binding = m_vbo[1];
		vb15.buffer				  = m_vbo[1];
		vb15.offset				  = 16;
		vb15.stride				  = 32;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		glVertexAttribFormat(15, 1, GL_HALF_FLOAT, GL_FALSE, 1024);
		va15.array_size		 = 1;
		va15.array_type		 = GL_HALF_FLOAT;
		va15.relative_offset = 1024;
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribFormat state change check failed.\n");
			status = false;
		}

		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[2]);
		glVertexAttribPointer(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 8, (void*)640);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		va0.array_size			 = 4;
		va0.array_type			 = GL_UNSIGNED_BYTE;
		va0.array_stride		 = 8;
		va0.array_pointer		 = 640;
		va0.relative_offset		 = 0;
		va0.array_normalized	 = 0;
		va0.binding				 = 0;
		va0.array_buffer_binding = m_vbo[2];
		vb0.buffer				 = m_vbo[2];
		vb0.offset				 = 640;
		vb0.stride				 = 8;
		va2.array_buffer_binding = m_vbo[2];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glVertexAttribPointer state change check failed.\n");
			status = false;
		}

		glBindVertexBuffer(0, m_vbo[1], 80, 24);
		vb0.buffer				 = m_vbo[1];
		vb0.offset				 = 80;
		vb0.stride				 = 24;
		va2.array_buffer_binding = m_vbo[1];
		va0.array_buffer_binding = m_vbo[1];
		if (!va0.stateVerify() || !vb0.stateVerify() || !va2.stateVerify() || !vb2.stateVerify() ||
			!va15.stateVerify() || !vb15.stateVerify())
		{
			Output("glBindVertexBuffer state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}